

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_util.cc
# Opt level: O3

string * extract_module_name_abi_cxx11_(string *__return_storage_ptr__,char *name)

{
  ulong uVar1;
  undefined8 uVar2;
  allocator<char> local_31;
  size_type *local_30;
  ulong local_28;
  size_type local_20;
  undefined8 uStack_18;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,name,&local_31);
  uVar1 = std::__cxx11::string::rfind((char *)&local_30,0x10a904,0xffffffffffffffff);
  if (uVar1 == 0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"GLOBAL","");
    if (local_30 != &local_20) {
      operator_delete(local_30,local_20 + 1);
    }
  }
  else {
    if (local_28 < uVar1) {
      uVar2 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",uVar1);
      if (local_30 != &local_20) {
        operator_delete(local_30,local_20 + 1);
      }
      _Unwind_Resume(uVar2);
    }
    *(undefined1 *)((long)local_30 + uVar1) = 0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_30 == &local_20) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_20;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_18;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_30;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_20;
    }
    __return_storage_ptr__->_M_string_length = uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

string extract_module_name(const char* name) {
    string module_name = name;
    string::size_type pos = module_name.rfind("::");

    if ( pos == string::npos )
        return string(GLOBAL_MODULE_NAME);

    module_name.erase(pos);

    return module_name;
}